

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_enum_all_first(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  int iVar2;
  MTBDD MVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong variables_00;
  
  if (dd != 0) {
    iVar2 = mtbdd_isleaf(dd);
    if (iVar2 == 0) {
      lVar6 = (variables & 0xffffffffff) * 0x10;
      puVar1 = nodes->data;
      variables_00 = variables & 0x8000000000000000 ^
                     *(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff;
      lVar4 = (dd & 0xffffffffff) * 0x10;
      uVar5 = dd;
      if ((*(ulong *)(puVar1 + lVar6 + 8) ^ *(ulong *)(puVar1 + lVar4 + 8)) < 0x10000000000) {
        uVar5 = dd & 0x8000000000000000;
        dd = *(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff | uVar5;
        uVar5 = *(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff ^ uVar5;
      }
      MVar3 = mtbdd_enum_all_first(dd,variables_00,arr + 1,filter_cb);
      if (MVar3 != 0) {
        *arr = '\0';
        return MVar3;
      }
      MVar3 = mtbdd_enum_all_first(uVar5,variables_00,arr + 1,filter_cb);
      if (MVar3 != 0) {
        *arr = '\x01';
        return MVar3;
      }
    }
    else if ((filter_cb == (mtbdd_enum_filter_cb)0x0) || (iVar2 = (*filter_cb)(dd), iVar2 != 0)) {
      for (; variables != 0x8000000000000000; variables = mtbdd_gethigh(variables)) {
        *arr = '\0';
        arr = arr + 1;
      }
      return dd;
    }
  }
  return 0;
}

Assistant:

MTBDD
mtbdd_enum_all_first(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf False is skipped
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // if this assertion fails, then <variables> is not the support of <dd>.
        // actually, remove this check to allow for "partial" enumeration
        // assert(mtbdd_isleaf(dd));
        // for _first, just return the leaf; there is nothing to set, though.
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        return dd;
    } else if (mtbdd_isleaf(dd)) {
        // a leaf for which the filter returns 0 is skipped
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        // for all remaining variables, set to 0
        while (variables != mtbdd_true) {
            *arr++ = 0;
            variables = mtbdd_gethigh(variables);
        }
        return dd;
    } else {
        // get next variable from <variables>
        mtbddnode_t nv = MTBDD_GETNODE(variables);
        variables = node_gethigh(variables, nv);

        // get cofactors
        mtbddnode_t ndd = MTBDD_GETNODE(dd);
        MTBDD low, high;
        if (mtbddnode_getvariable(ndd) == mtbddnode_getvariable(nv)) {
            low = node_getlow(dd, ndd);
            high = node_gethigh(dd, ndd);
        } else {
            low = high = dd;
        }

        // first maybe follow low
        MTBDD res = mtbdd_enum_all_first(low, variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 0;
            return res;
        }

        // if not low, try following high
        res = mtbdd_enum_all_first(high, variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 1;
            return res;
        }

        // we've tried low and high, return false
        return mtbdd_false;
    }
}